

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O0

Cluster * __thiscall cnn::Cluster::add_child(Cluster *this,uint sym)

{
  bool bVar1;
  pair<unsigned_int,_unsigned_int> *__x;
  size_type sVar2;
  pointer ppVar3;
  reference ppCVar4;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000028;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000030;
  Cluster *c;
  uint i;
  iterator it;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_28;
  uint local_1c;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_18 [3];
  
  local_18[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::find(in_stack_ffffffffffffff88,(key_type *)0x5e97d5);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::__detail::operator==(local_18,&local_28);
  if (bVar1) {
    __x = (pair<unsigned_int,_unsigned_int> *)operator_new(0xb8);
    Cluster((Cluster *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (in_stack_00000030,in_stack_00000028);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,&__x->first);
    sVar2 = std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>::size
                      ((vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_> *)in_RDI);
    local_1c = (uint)sVar2;
    std::make_pair<unsigned_int&,unsigned_int&>((uint *)in_stack_ffffffffffffff88,(uint *)0x5e9883);
    std::
    unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
    ::insert<std::pair<unsigned_int,unsigned_int>>(in_RDI,__x);
    std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>::push_back
              ((vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_> *)in_RDI,(value_type *)__x);
  }
  else {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false> *
                        )0x5e98d5);
    local_1c = ppVar3->second;
  }
  ppCVar4 = std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>::operator[]
                      ((vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_> *)in_RDI,
                       (ulong)local_1c);
  return *ppCVar4;
}

Assistant:

Cluster* Cluster::add_child(unsigned sym) {
  assert (!initialized);
  assert (terminals.size() == 0);
  auto it = word2ind.find(sym);
  unsigned i;
  if (it == word2ind.end()) {
    Cluster* c = new Cluster();
    c->path = path;
    c->path.push_back(sym);
    i = children.size();
    word2ind.insert(make_pair(sym, i));
    children.push_back(c);
    assert (c != NULL);
  }
  else {
    i = it->second;
  }
  return children[i];
}